

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O0

void __thiscall Jinx::Variant::SetString(Variant *this,String *value)

{
  String *value_local;
  Variant *this_local;
  
  Destroy(this);
  this->m_type = String;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
            (&(this->field_1).m_string);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator=
            (&(this->field_1).m_string,value);
  return;
}

Assistant:

inline_t void Variant::SetString(const String & value)
	{
		Destroy();
		m_type = ValueType::String;
		new(&m_string) String();
		m_string = value;
	}